

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecjpake.c
# Opt level: O1

int mbedtls_ecjpake_write_round_one
              (mbedtls_ecjpake_context *ctx,uchar *buf,size_t len,size_t *olen,
              _func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng)

{
  mbedtls_ecp_point *G;
  char *id;
  int iVar1;
  uchar *local_40;
  uchar *p;
  
  p._0_4_ = ctx->md_type;
  p._4_4_ = ctx->point_format;
  G = &(ctx->grp).G;
  id = ecjpake_id[ctx->role];
  local_40 = buf;
  iVar1 = ecjpake_kkp_write((mbedtls_md_type_t)p,&ctx->grp,p._4_4_,G,&ctx->xm1,&ctx->Xm1,id,
                            &local_40,buf + len,f_rng,p_rng);
  if (iVar1 == 0) {
    iVar1 = ecjpake_kkp_write((mbedtls_md_type_t)p,&ctx->grp,p._4_4_,G,&ctx->xm2,&ctx->Xm2,id,
                              &local_40,buf + len,f_rng,p_rng);
    if (iVar1 == 0) {
      *olen = (long)local_40 - (long)buf;
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int mbedtls_ecjpake_write_round_one(mbedtls_ecjpake_context *ctx,
                                    unsigned char *buf, size_t len, size_t *olen,
                                    int (*f_rng)(void *, unsigned char *, size_t),
                                    void *p_rng)
{
    return ecjpake_kkpp_write(ctx->md_type, &ctx->grp, ctx->point_format,
                              &ctx->grp.G,
                              &ctx->xm1, &ctx->Xm1, &ctx->xm2, &ctx->Xm2,
                              ID_MINE, buf, len, olen, f_rng, p_rng);
}